

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderStart(Fts3Table *p,Fts3MultiSegReader *pCsr,char *zTerm,int nTerm)

{
  long in_RDX;
  long *in_RSI;
  int rc;
  Fts3SegReader *pSeg;
  int res;
  int nSeg;
  int i;
  char *in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 uVar1;
  int in_stack_ffffffffffffffc4;
  long in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int local_28;
  
  uVar2 = (undefined4)in_RSI[1];
  local_28 = 0;
  while( true ) {
    uVar1 = false;
    if (*(int *)((long)in_RSI + 0x2c) == 0) {
      uVar1 = local_28 < (int)in_RSI[1];
    }
    if ((bool)uVar1 == false) break;
    in_stack_ffffffffffffffd0 = 0;
    in_stack_ffffffffffffffc8 = *(long *)(*in_RSI + (long)local_28 * 8);
    do {
      in_stack_ffffffffffffffc4 = fts3SegReaderNext(p,(Fts3SegReader *)pCsr,zTerm._4_4_);
      if (in_stack_ffffffffffffffc4 != 0) {
        return in_stack_ffffffffffffffc4;
      }
      in_stack_ffffffffffffffc2 = false;
      if (in_RDX != 0) {
        in_stack_ffffffffffffffd0 =
             fts3SegReaderTermCmp
                       ((Fts3SegReader *)(ulong)CONCAT13(uVar1,(uint3)in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,0);
        in_stack_ffffffffffffffc2 = in_stack_ffffffffffffffd0 < 0;
      }
    } while ((bool)in_stack_ffffffffffffffc2 != false);
    if ((*(char *)(in_stack_ffffffffffffffc8 + 4) != '\0') && (in_stack_ffffffffffffffd0 != 0)) {
      fts3SegReaderSetEof((Fts3SegReader *)0x241993);
    }
    local_28 = local_28 + 1;
  }
  fts3SegReaderSort((Fts3SegReader **)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                    (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8,
                    (_func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *)
                    CONCAT44(in_stack_ffffffffffffffc4,
                             (uint)CONCAT12(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)));
  return 0;
}

Assistant:

static int fts3SegReaderStart(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr,       /* Cursor object */
  const char *zTerm,              /* Term searched for (or NULL) */
  int nTerm                       /* Length of zTerm in bytes */
){
  int i;
  int nSeg = pCsr->nSegment;

  /* If the Fts3SegFilter defines a specific term (or term prefix) to search
  ** for, then advance each segment iterator until it points to a term of
  ** equal or greater value than the specified term. This prevents many
  ** unnecessary merge/sort operations for the case where single segment
  ** b-tree leaf nodes contain more than one term.
  */
  for(i=0; pCsr->bRestart==0 && i<pCsr->nSegment; i++){
    int res = 0;
    Fts3SegReader *pSeg = pCsr->apSegment[i];
    do {
      int rc = fts3SegReaderNext(p, pSeg, 0);
      if( rc!=SQLITE_OK ) return rc;
    }while( zTerm && (res = fts3SegReaderTermCmp(pSeg, zTerm, nTerm))<0 );

    if( pSeg->bLookup && res!=0 ){
      fts3SegReaderSetEof(pSeg);
    }
  }
  fts3SegReaderSort(pCsr->apSegment, nSeg, nSeg, fts3SegReaderCmp);

  return SQLITE_OK;
}